

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

int av1_rc_regulate_q(AV1_COMP *cpi,int target_bits_per_frame,int active_best_quality,
                     int active_worst_quality,int width,int height)

{
  uint64_t uVar1;
  AQ_MODE AVar2;
  aom_bit_depth_t bit_depth;
  AV1_PRIMARY *pAVar3;
  CYCLIC_REFRESH *pCVar4;
  RefCntBuffer *pRVar5;
  uint64_t uVar6;
  long lVar7;
  long lVar8;
  LAYER_CONTEXT *pLVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint qindex;
  int iVar21;
  uint uVar22;
  bool bVar23;
  double dVar24;
  double qstart;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  iVar12 = av1_get_MBs(width,height);
  dVar24 = get_rate_correction_factor(cpi,width,height);
  uVar14 = 0;
  if ((cpi->oxcf).q_cfg.aq_mode == '\x03') {
    uVar14 = (uint)(cpi->cyclic_refresh->apply_cyclic_refresh != 0);
  }
  iVar15 = (int)((ulong)((long)target_bits_per_frame << 9) / (ulong)(long)iVar12);
  uVar18 = active_best_quality;
  iVar12 = active_worst_quality;
  if (active_best_quality < active_worst_quality) {
    do {
      iVar21 = (int)(iVar12 + uVar18) >> 1;
      iVar13 = get_bits_per_mb(cpi,uVar14,dVar24,iVar21);
      if (iVar15 < iVar13) {
        uVar18 = iVar21 + 1;
        iVar21 = iVar12;
      }
      iVar12 = iVar21;
    } while ((int)uVar18 < iVar21);
  }
  iVar12 = get_bits_per_mb(cpi,uVar14,dVar24,uVar18);
  iVar13 = iVar15 - iVar12;
  iVar21 = 0x7fffffff;
  if (iVar15 < iVar12) {
    iVar13 = 0x7fffffff;
  }
  if ((uVar18 != active_best_quality) && (iVar13 != 0x7fffffff)) {
    iVar21 = get_bits_per_mb(cpi,uVar14,dVar24,uVar18 - 1);
    iVar21 = iVar21 - iVar15;
  }
  if (iVar21 < iVar13) {
    uVar18 = uVar18 - 1;
  }
  if ((cpi->oxcf).rc_cfg.mode != AOM_CBR) {
    return uVar18;
  }
  if ((cpi->oxcf).pass != AOM_RC_ONE_PASS) {
    return uVar18;
  }
  pAVar3 = cpi->ppi;
  if (pAVar3->lap_enabled != 0) {
    return uVar18;
  }
  iVar12 = (cpi->rc).rc_1_frame;
  if (((iVar12 == -1) && (1000 < (cpi->rc).frame_source_sad)) &&
     ((pAVar3->p_rc).buffer_level < (pAVar3->p_rc).optimal_buffer_level >> 1)) {
    iVar15 = (cpi->rc).frames_since_key;
    bVar10 = 4 < iVar15;
    uVar14 = 0x14;
    if (4 < iVar15) {
      uVar14 = 0x78;
    }
  }
  else {
    bVar10 = false;
    uVar14 = 0x14;
  }
  iVar15 = (cpi->rc).avg_frame_bandwidth;
  iVar13 = iVar15 - (cpi->rc).prev_avg_frame_bandwidth;
  iVar21 = -iVar13;
  if (0 < iVar13) {
    iVar21 = iVar13;
  }
  AVar2 = (cpi->oxcf).q_cfg.aq_mode;
  if ((AVar2 == '\x03') && (pCVar4 = cpi->cyclic_refresh, pCVar4->apply_cyclic_refresh != 0)) {
    if ((cpi->is_screen_content_type == 0) || (pCVar4->sb_index <= pCVar4->last_sb_index)) {
      uVar17 = (cpi->rc).q_1_frame;
      uVar22 = 0x10;
      if ((int)uVar17 < 0x88) {
        uVar19 = uVar17 >> 3;
        bVar23 = SBORROW4(uVar17,8);
        iVar13 = uVar17 - 8;
        goto LAB_0020d82f;
      }
    }
    else {
      uVar17 = (cpi->rc).q_1_frame;
      uVar22 = 8;
      if ((int)uVar17 < 0x120) {
        uVar19 = uVar17 >> 5;
        bVar23 = SBORROW4(uVar17,0x20);
        iVar13 = uVar17 - 0x20;
LAB_0020d82f:
        uVar22 = 1;
        if (bVar23 == iVar13 < 0) {
          uVar22 = uVar19;
        }
      }
    }
    if ((cpi->is_screen_content_type != 0) && (pAVar3->use_svc == 0)) {
      if ((pAVar3->p_rc).optimal_buffer_level < (pAVar3->p_rc).buffer_level) {
        bVar23 = uVar22 < 5;
        uVar14 = 4;
      }
      else {
        if (bVar10) goto LAB_0020d876;
        bVar23 = uVar22 < 9;
        uVar14 = 8;
      }
      if (!bVar23) {
        uVar14 = uVar22;
      }
    }
  }
  else {
    uVar17 = (cpi->rc).q_1_frame;
    if (cpi->is_screen_content_type == 0) {
      uVar22 = 0x10;
      if ((int)uVar17 < 0x88) {
        uVar19 = uVar17 >> 3;
        bVar23 = SBORROW4(uVar17,8);
        iVar13 = -8;
        goto LAB_0020d805;
      }
    }
    else {
      uVar22 = 8;
      if ((int)uVar17 < 0x90) {
        uVar19 = uVar17 >> 4;
        bVar23 = SBORROW4(uVar17,0x10);
        iVar13 = -0x10;
LAB_0020d805:
        uVar22 = 1;
        if (bVar23 == (int)(uVar17 + iVar13) < 0) {
          uVar22 = uVar19;
        }
      }
    }
  }
LAB_0020d876:
  if (((((cpi->sf).rt_sf.rc_faster_convergence_static == 1) &&
       ((cpi->sf).rt_sf.check_scene_detection != 0)) && ((cpi->rc).frame_source_sad == 0)) &&
     ((cpi->rc).static_since_last_scene_change != 0)) {
    lVar7 = (pAVar3->p_rc).optimal_buffer_level;
    lVar8 = (pAVar3->p_rc).buffer_level;
    if ((lVar7 >> 1 < lVar8 && AVar2 == '\x03') &&
       (4 < cpi->cyclic_refresh->counter_encode_maxq_scene_change)) {
      uVar14 = 0x20;
      if (lVar7 < lVar8) {
        uVar14 = 0x3c;
      }
      uVar19 = 0;
      if (iVar12 == 1) {
        uVar19 = (uint)(lVar8 <= lVar7) << 4 | 0xffffffe0;
      }
      uVar18 = uVar19 + uVar18;
      if (uVar22 <= uVar14) {
        uVar22 = uVar14;
      }
      uVar14 = 4;
    }
  }
  pRVar5 = (cpi->common).prev_frame;
  if (pRVar5 == (RefCntBuffer *)0x0) {
    bVar23 = false;
  }
  else {
    bVar23 = true;
    if (pRVar5->width == width) {
      bVar23 = pRVar5->height != height || (double)iVar15 * 0.1 < (double)iVar21;
    }
  }
  if (((((cpi->common).current_frame.frame_type & 0xfd) != 0) &&
      (uVar19 = (cpi->rc).frames_since_key, 1 < (int)uVar19)) &&
     ((0 < (int)uVar17 && (uVar20 = (cpi->rc).q_2_frame, 0 < (int)uVar20)))) {
    if (pAVar3->use_svc == 0) {
      if (bVar23) goto LAB_0020dbf6;
    }
    else if ((cpi->svc).current_superframe <= (uint)(cpi->svc).number_temporal_layers || bVar23)
    goto LAB_0020dbf6;
    if (((cpi->rc).rtc_external_ratectrl == 0) &&
       (((cpi->oxcf).rc_cfg.gf_cbr_boost_pct == 0 ||
        (((cpi->refresh_frame).alt_ref_frame == false &&
         ((cpi->refresh_frame).golden_frame == false)))))) {
      qindex = uVar18;
      if ((!bVar10 && uVar17 != uVar20) && (cpi->rc).rc_2_frame * iVar12 == -1) {
        uVar11 = uVar20;
        if (uVar17 < uVar20) {
          uVar11 = uVar17;
        }
        if (uVar20 < uVar17) {
          uVar20 = uVar17;
        }
        if ((int)uVar18 < (int)uVar20) {
          uVar20 = uVar18;
        }
        qindex = uVar20;
        if ((int)uVar18 < (int)uVar11) {
          qindex = uVar11;
        }
        if (((10 < uVar19) && (iVar12 == -1)) && ((int)qindex < (int)uVar18)) {
          qindex = (int)(qindex + uVar18) >> 1;
        }
      }
      if ((((cpi->sf).rt_sf.check_scene_detection != 0) &&
          (uVar6 = (cpi->rc).prev_avg_source_sad, 10 < uVar19 && uVar6 != 0)) &&
         ((cpi->rc).frame_source_sad != 0)) {
        uVar1 = (cpi->rc).avg_source_sad;
        auVar25._8_4_ = (int)(uVar1 >> 0x20);
        auVar25._0_8_ = uVar1;
        auVar25._12_4_ = 0x45300000;
        auVar26._8_4_ = (int)(uVar6 >> 0x20);
        auVar26._0_8_ = uVar6;
        auVar26._12_4_ = 0x45300000;
        dVar24 = ((auVar25._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 ((auVar26._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) + -1.0;
        if (((0.0 <= dVar24) ||
            ((pAVar3->p_rc).buffer_level <= (pAVar3->p_rc).optimal_buffer_level >> 2)) ||
           ((int)qindex <= (cpi->rc).worst_quality >> 1)) {
          if (((int)qindex < (int)uVar17) && (0.1 < dVar24)) {
            lVar7 = (pAVar3->p_rc).optimal_buffer_level;
            lVar8 = (pAVar3->p_rc).maximum_buffer_size;
            lVar16 = lVar7 * 2;
            if (SBORROW8(lVar8,lVar16) != lVar8 + lVar7 * -2 < 0) {
              lVar16 = lVar8;
            }
            if ((pAVar3->p_rc).buffer_level < lVar16) {
              qindex = (int)(qindex * 3 + uVar17) >> 2;
            }
          }
        }
        else {
          bit_depth = ((cpi->common).seq_params)->bit_depth;
          dVar24 = tanh(dVar24 * 4.0);
          qstart = av1_convert_qindex_to_q(qindex,bit_depth);
          iVar12 = av1_compute_qdelta(&cpi->rc,qstart,(dVar24 * 0.5 + 1.0) * qstart,bit_depth);
          qindex = iVar12 + qindex;
          uVar17 = (cpi->rc).q_1_frame;
        }
      }
      if ((int)uVar22 < (int)(uVar17 - qindex)) {
        uVar18 = uVar17 - uVar22;
      }
      else {
        uVar18 = uVar17 + uVar14;
        if ((int)(qindex - uVar17) <= (int)uVar14) {
          uVar18 = qindex;
        }
      }
    }
  }
LAB_0020dbf6:
  iVar12 = (cpi->svc).number_temporal_layers;
  uVar14 = uVar18;
  if ((((1 < iVar12) && ((cpi->svc).spatial_layer_id == 0 && !bVar23)) &&
      ((cpi->rc).rtc_external_ratectrl == 0)) && ((cpi->oxcf).resize_cfg.resize_mode != '\x03')) {
    iVar15 = (cpi->svc).temporal_layer_id;
    if (iVar15 < 1) {
      if (((iVar15 == 0) && (((cpi->common).current_frame.frame_type & 0xfd) != 0)) &&
         (((pAVar3->p_rc).optimal_buffer_level >> 2 < (pAVar3->p_rc).buffer_level &&
          ((cpi->rc).frame_source_sad < 100000)))) {
        uVar14 = uVar18 - 4;
        if (iVar12 != 2) {
          uVar14 = uVar18 - 10;
        }
      }
    }
    else {
      pLVar9 = (cpi->svc).layer_context;
      if (((cpi->rc).avg_frame_bandwidth < (pLVar9->rc).avg_frame_bandwidth) &&
         (uVar14 = (pLVar9->p_rc).last_q[iVar12 <= (cpi->rc).frames_since_key] - 4,
         (int)uVar14 < (int)uVar18)) {
        uVar14 = uVar18;
      }
    }
  }
  if (((cpi->ppi->use_svc == 0) &&
      (pRVar5 = (cpi->common).prev_frame, pRVar5 != (RefCntBuffer *)0x0)) &&
     ((double)pRVar5->height * (double)pRVar5->width * 1.5 < (double)(height * width))) {
    uVar14 = (int)(uVar14 + active_worst_quality) >> 1;
  }
  if ((cpi->ppi->rtc_ref).bias_recovery_frame == true) {
    iVar15 = av1_svc_get_min_ref_dist(cpi);
    iVar12 = 0x14;
    if (iVar15 < 0x14) {
      iVar12 = iVar15;
    }
    uVar14 = uVar14 - iVar12;
  }
  uVar18 = (cpi->rc).worst_quality;
  uVar17 = (cpi->rc).best_quality;
  if ((int)uVar14 < (int)uVar18) {
    uVar18 = uVar14;
  }
  if ((int)uVar18 <= (int)uVar17) {
    uVar18 = uVar17;
  }
  return uVar18;
}

Assistant:

int av1_rc_regulate_q(const AV1_COMP *cpi, int target_bits_per_frame,
                      int active_best_quality, int active_worst_quality,
                      int width, int height) {
  const int MBs = av1_get_MBs(width, height);
  const double correction_factor =
      get_rate_correction_factor(cpi, width, height);
  const int target_bits_per_mb =
      (int)(((uint64_t)target_bits_per_frame << BPER_MB_NORMBITS) / MBs);

  int q =
      find_closest_qindex_by_rate(target_bits_per_mb, cpi, correction_factor,
                                  active_best_quality, active_worst_quality);
  if (cpi->oxcf.rc_cfg.mode == AOM_CBR && has_no_stats_stage(cpi))
    return adjust_q_cbr(cpi, q, active_worst_quality, width, height);

  return q;
}